

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.cxx
# Opt level: O0

void testSaveLoad<(andres::CoordinateOrder)1,(andres::CoordinateOrder)1>(void)

{
  reference puVar1;
  allocator<unsigned_char> local_a1;
  CoordinateOrder local_a0;
  uchar local_99;
  undefined1 local_98 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string fileName;
  size_t shape [2];
  
  fileName.field_2._8_8_ = 2;
  shape[0] = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"test.bmp",&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_99 = '\0';
  local_a0 = LastMajorOrder;
  std::allocator<unsigned_char>::allocator(&local_a1);
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_98,
             (unsigned_long *)(fileName.field_2._M_local_buf + 8),shape + 1,&local_99,&local_a0,
             &local_a1);
  std::allocator<unsigned_char>::~allocator(&local_a1);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,1,0);
  *puVar1 = 200;
  andres::bmp::save<unsigned_char>
            ((string *)local_38,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_98);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_98);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.bmp";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::bmp::save(fileName, m);
    }
    /*
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
    */
}